

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

List<int> * __thiscall
Monad::Monad<List,void>::bind<____C_A_T_C_H____T_E_S_T____10()::__0,int,List<int>>
          (List<int> *__return_storage_ptr__,Monad<List,void> *this,List<int> *l,
          anon_class_1_0_00000001 *f)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  back_insert_iterator<List<int>_> __result;
  undefined1 local_60 [8];
  result_of_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_toby_allsopp[P]free_monads_in_cpp_test_ListTest_cpp:36:5)_(int)>
  subresult;
  int *x;
  const_iterator __end0;
  const_iterator __begin0;
  List<int> *__range2;
  anon_class_1_0_00000001 *f_local;
  List<int> *l_local;
  List<int> *result;
  
  List<int>::List(__return_storage_ptr__);
  __end0 = std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)this);
  x = (int *)std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)&x), bVar1) {
    subresult.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
         operator*(&__end0);
    ____C_A_T_C_H____T_E_S_T____10::anon_class_1_0_00000001::operator()
              ((result_of_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_toby_allsopp[P]free_monads_in_cpp_test_ListTest_cpp:36:5)_(int)>
                *)local_60,(anon_class_1_0_00000001 *)l,
               *subresult.super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    __first = std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_60);
    __last = std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)local_60);
    __result = std::back_inserter<List<int>>(__return_storage_ptr__);
    std::
    copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::back_insert_iterator<List<int>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current
               ,__result);
    List<int>::~List((List<int> *)local_60);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

static ListB bind(const List<A>& l, F&& f) {
      ListB result;
      for (const A& x : l) {
        auto subresult = std::forward<F>(f)(x);
        std::copy(subresult.begin(), subresult.end(), std::back_inserter(result));
      }
      return result;
    }